

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O0

void __thiscall
MergeTest_MergeCompareTime_Test_Test::~MergeTest_MergeCompareTime_Test_Test
          (MergeTest_MergeCompareTime_Test_Test *this)

{
  MergeTest_MergeCompareTime_Test_Test *this_local;
  
  ~MergeTest_MergeCompareTime_Test_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(MergeTest, MergeCompareTime_Test) {
    // 1000 heaps with 1000 keys
    std::mt19937 generator(time(0));
    const size_t size = 1000, number = 1000;
    std::vector<int> values(number*size);
    for (int i = 0; i < size * number; i++) {
        values[i] = generator();
    }

    // in order to test binomial, skew and leftist we create 1 fool heap with size * number
    // keys as merging would be too slow
    // it does not change the correctness of the test

    for (int type = 0; type < 3; type++) {
        FoolHeapList fool;
        fool.AddHeap(values[0]);
        HeapList tested(type);

        for (int i = 0; i < size * number - 1; i++)
            fool.Insert(0, values[i + 1]);

        for (int numHeap = 0; numHeap < number; numHeap++) {
            tested.AddHeap(values[numHeap * 1000]);

            for (int elem = 1; elem < size; elem++)
                tested.Insert(numHeap, values[numHeap * 1000 + elem]);
        }

        clock_t t = clock();

        for (int numHeap = 1; numHeap < number; numHeap++) {
            tested.Meld(0, numHeap);
        }

        t = clock() - t;

        std::cout << "time of merging for heap of type " << type << ' ' << double(t) / CLOCKS_PER_SEC << std::endl;

        for (int i = 0; i < size * number; i++) {
            EXPECT_TRUE(fool.ExtractMin(0) == tested.ExtractMin(0));
        }
    }
}